

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O2

int CVmObjString::getp_findAll(vm_val_t *retval,vm_val_t *self_val,char *str,uint *argc)

{
  vm_val_t *pvVar1;
  vm_val_t *pvVar2;
  undefined1 uVar3;
  uint uVar4;
  CRegexSearcherSimple *pCVar5;
  anon_union_8_8_cb74652f_for_val aVar6;
  vm_datatype_t *pvVar7;
  undefined4 uVar8;
  CVmObjPageEntry *this;
  int iVar9;
  uint uVar10;
  vm_obj_id_t vVar11;
  char *substr;
  char *str_00;
  size_t sVar12;
  long lVar13;
  char *str_01;
  uint uVar14;
  CVmObjPageEntry *pat;
  ulong uVar15;
  ulong len;
  uint local_100;
  int match_len;
  vm_val_t *local_f8;
  uint local_ec;
  ulong local_e8;
  ulong local_e0;
  size_t local_d8;
  char *local_d0;
  uint local_c4;
  CVmObjPageEntry *local_c0;
  vm_val_t ele;
  int match_cofs;
  vm_rcdesc rc;
  
  if (argc == (uint *)0x0) {
    uVar14 = 0;
  }
  else {
    uVar14 = *argc;
  }
  if ((getp_findAll(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') &&
     (iVar9 = __cxa_guard_acquire(&getp_findAll(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)
                                   ::desc), iVar9 != 0)) {
    getp_findAll::desc.min_argc_ = 1;
    getp_findAll::desc.opt_argc_ = 1;
    getp_findAll::desc.varargs_ = 0;
    __cxa_guard_release(&getp_findAll(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc);
  }
  iVar9 = CVmObject::get_prop_check_argc(retval,argc,&getp_findAll::desc);
  pvVar1 = sp_;
  if (iVar9 == 0) {
    local_e0 = (ulong)*(ushort *)str;
    pvVar2 = sp_ + -1;
    local_ec = uVar14;
    substr = vm_val_t::get_as_string(pvVar2);
    local_e8 = 0;
    if (substr == (char *)0x0) {
      if ((pvVar2->typ != VM_OBJ) ||
         (uVar4 = pvVar1[-1].val.obj, uVar10 = uVar4 & 0xfff,
         iVar9 = (**(code **)(*(long *)&G_obj_table_X.pages_[uVar4 >> 0xc][uVar10].ptr_ + 8))
                           (G_obj_table_X.pages_[uVar4 >> 0xc] + uVar10,
                            CVmObjPattern::metaclass_reg_), iVar9 == 0)) goto LAB_002a5537;
      uVar4 = pvVar1[-1].val.obj;
      if (G_obj_table_X.pages_[uVar4 >> 0xc] == (CVmObjPageEntry *)0x0) goto LAB_002a5537;
      pat = G_obj_table_X.pages_[uVar4 >> 0xc] + (uVar4 & 0xfff);
    }
    else {
      pat = (CVmObjPageEntry *)0x0;
    }
    local_100 = 0xfffffffe;
    if (local_ec < 2) {
      local_100 = 0xfffffffe;
      local_f8 = (vm_val_t *)0x0;
    }
    else {
      pvVar1 = sp_ + -2;
      local_f8 = pvVar1;
      if (sp_[-2].typ != VM_NIL) {
        iVar9 = vm_val_t::is_func_ptr(pvVar1);
        if (iVar9 == 0) {
LAB_002a5537:
          err_throw(0x900);
        }
        CVmFuncPtr::set((CVmFuncPtr *)&rc,pvVar1);
        uVar3 = (undefined1)(rc.argp)->typ;
        local_100 = (byte)uVar3 & 0x7f;
        if ((char)uVar3 < '\0') {
          local_e8 = 0xffffffffffffffff;
        }
        else {
          local_e8 = (ulong)(*(byte *)((long)&(rc.argp)->typ + 1) + local_100);
        }
        local_100 = local_100 - 2;
      }
    }
    str_01 = str + 2;
    local_d8 = 0;
    vVar11 = CVmObjList::create(0,10);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar11;
    local_c0 = G_obj_table_X.pages_[vVar11 >> 0xc] + (vVar11 & 0xfff);
    CVmObjList::cons_clear((CVmObjList *)local_c0);
    pvVar1 = sp_;
    uVar8 = *(undefined4 *)&retval->field_0x4;
    aVar6 = retval->val;
    sp_ = sp_ + 1;
    pvVar1->typ = retval->typ;
    *(undefined4 *)&pvVar1->field_0x4 = uVar8;
    pvVar1->val = aVar6;
    iVar9 = (int)local_e8;
    local_c4 = iVar9 - 2;
    len = local_e0;
    local_d0 = str_01;
    while ((pvVar1 = local_f8, len != 0 &&
           (str_00 = find_substr(self_val,local_d0,str_01,len,substr,(CVmObjPattern *)pat,
                                 &match_cofs,&match_len), str_00 != (char *)0x0))) {
      if (pvVar1 == (vm_val_t *)0x0) {
        vVar11 = create(0,str_00,(long)match_len);
        ele.typ = VM_OBJ;
        ele.val.obj = vVar11;
      }
      else {
        uVar4 = G_bif_tads_globals_X->rex_searcher->group_cnt_;
        uVar10 = local_c4;
        if ((int)local_e8 == -1) {
          uVar10 = uVar4;
        }
        if ((int)uVar10 <= (int)local_100) {
          uVar10 = local_100;
        }
        uVar14 = 0;
        local_e0 = len;
        for (uVar15 = (ulong)uVar10; pvVar1 = sp_, 0 < (int)uVar15; uVar15 = uVar15 - 1) {
          if ((((int)uVar4 < (int)uVar15) ||
              (pCVar5 = G_bif_tads_globals_X->rex_searcher,
              *(int *)((long)&(pCVar5->super_CRegexSearcher).stack_.used_ + uVar15 * 8 + 4) < 0)) ||
             (*(int *)(&(pCVar5->super_CRegexSearcher).field_0x20 + uVar15 * 8) < 0)) {
            pvVar7 = &sp_->typ;
            sp_ = sp_ + 1;
            *pvVar7 = VM_NIL;
          }
          else {
            sp_ = sp_ + 1;
            lVar13 = (long)*(int *)((long)&(pCVar5->super_CRegexSearcher).stack_.used_ +
                                   uVar15 * 8 + 4);
            vVar11 = create(0,local_d0 + lVar13,
                            *(int *)(&(pCVar5->super_CRegexSearcher).field_0x20 + uVar15 * 8) -
                            lVar13);
            pvVar1->typ = VM_OBJ;
            (pvVar1->val).obj = vVar11;
          }
          uVar14 = uVar14 + 1;
        }
        if (1 < iVar9 || iVar9 == -1) {
          sp_ = sp_ + 1;
          sVar12 = utf8_ptr::s_len(local_d0,(long)str_00 - (long)local_d0);
          pvVar1->typ = VM_INT;
          (pvVar1->val).obj = (int)sVar12 + 1;
          uVar14 = uVar14 + 1;
        }
        len = local_e0;
        pvVar2 = local_f8;
        pvVar1 = sp_;
        if (0 < iVar9 || iVar9 == -1) {
          sp_ = sp_ + 1;
          vVar11 = create(0,str_00,(long)match_len);
          pvVar1->typ = VM_OBJ;
          (pvVar1->val).obj = vVar11;
          uVar14 = uVar14 + 1;
        }
        CVmRun::call_func_ptr(&G_interpreter_X,pvVar2,uVar14,&rc,0);
        ele.typ = r0_.typ;
        ele._4_4_ = r0_._4_4_;
        ele.val = r0_.val;
      }
      this = local_c0;
      sVar12 = local_d8;
      CVmObjList::cons_ensure_space((CVmObjList *)local_c0,local_d8,0);
      CVmObjList::cons_set_element((CVmObjList *)this,sVar12,&ele);
      lVar13 = (long)(((int)str_00 - (int)str_01) + match_len);
      str_01 = str_01 + lVar13;
      len = len - lVar13;
      if ((match_len == 0) && (len != 0)) {
        sVar12 = utf8_ptr::s_bytelen(str_01,1);
        str_01 = str_01 + sVar12;
      }
      local_d8 = local_d8 + 1;
    }
    **(undefined2 **)((long)&local_c0->ptr_ + 8) = (short)local_d8;
    sp_ = sp_ + -(long)(int)(local_ec + 1);
  }
  return 1;
}

Assistant:

int CVmObjString::getp_findAll(VMG_ vm_val_t *retval,
                               const vm_val_t *self_val, const char *str,
                               uint *argc)
{
    /* check arguments */
    uint orig_argc = (argc != 0 ? *argc : 0);
    static CVmNativeCodeDesc desc(1, 1);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the string length and buffer pointer */
    size_t len = vmb_get_len(str);
    str += VMB_LEN;

    /* remember the base string */
    const char *basestr = str;

    /* retrieve the string or regex pattern to find */
    vm_val_t *targ = G_stk->get(0);
    const char *targstr = 0;
    CVmObjPattern *targpat = 0;
    if ((targstr = targ->get_as_string(vmg0_)) != 0)
    {
        /* we have a simple string to find */
    }
    else if ((targpat = vm_val_cast(CVmObjPattern, targ)) != 0)
    {
        /* it's a pattern */
    }
    else
    {
        /* we need a string or a pattern; other values are invalid */
        err_throw(VMERR_BAD_TYPE_BIF);
    }

    /* retrieve the filter callback function, if present */
    vm_val_t *func = 0;
    int func_argc_min = 0, func_argc_max = 0;
    vm_rcdesc rc;
    if (orig_argc >= 2 && (func = G_stk->get(1))->typ != VM_NIL)
    {
        /* make sure it's a function */
        if (!func->is_func_ptr(vmg0_))
            err_throw(VMERR_BAD_TYPE_BIF);

        /* note how many arguments the function accepts */
        CVmFuncPtr fd(vmg_ func);
        func_argc_min = fd.get_min_argc();
        func_argc_max = fd.is_varargs() ? -1 : fd.get_max_argc();
    }

    /* 
     *   create a tentative list for the results (we'll resize this as needed
     *   as we add elements) 
     */
    retval->set_obj(CVmObjList::create(vmg_ FALSE, 10));
    CVmObjList *lst = (CVmObjList *)vm_objp(vmg_ retval->val.obj);

    /* clear it initially and push it for gc protection */
    lst->cons_clear();
    G_stk->push(retval);

    /* repeatedly search for the pattern */
    int cnt;
    for (cnt = 0 ; len != 0 ; ++cnt)
    {
        /* search for the next element */
        int match_cofs, match_len, match_bofs;
        const char *nxt = find_substr(
            vmg_ self_val, basestr, str, len, targstr, targpat,
            &match_cofs, &match_len);

        /* if we didn't find a match, we're done */
        if (nxt == 0)
            break;

        /* figure the byte offset of the match */
        match_bofs = nxt - str;

        /* call the callback, or just return the match text directly */
        vm_val_t ele;
        if (func == 0)
        {
            /* no callback - just use the match text, as a new string */
            ele.set_obj(CVmObjString::create(vmg_ FALSE, nxt, match_len));
        }
        else
        {
            /* we have a callback - push arguments */
            int fargc = 0;

            /*
             *   Figure out how many groups are populated, and how many the
             *   function expects.  If the function takes varargs, it expects
             *   all of the groups.  If it takes fixed arguments, it expects
             *   at most max_argc-2.  In addition, the function expects a
             *   minimum of min_argc-2 groups, and expects us to add nil
             *   arguments for any unpopulated groups to fill out that
             *   minimum.
             */
            int gc_actual = G_bif_tads_globals->rex_searcher->get_group_cnt();
            int gc_wanted = (func_argc_max == -1
                             ? gc_actual : func_argc_max - 2);
            if (gc_wanted < func_argc_min - 2)
                gc_wanted = func_argc_min - 2;

            /* push the groups, last to first */
            for (int i = gc_wanted ; i > 0 ; )
            {
                /* get the group, if it exists */
                const re_group_register *reg = 0;
                if (--i < gc_actual)
                {
                    /* valid group - get the group information */
                    reg = G_bif_tads_globals->rex_searcher->get_group_reg(i);
                }

                /* if the group is populated, push its text, otherwise nil */
                if (reg != 0 && reg->start_ofs >= 0 && reg->end_ofs >= 0)
                {
                    /* push the group text as a new string */
                    G_stk->push()->set_obj(CVmObjString::create(
                        vmg_ FALSE, basestr + reg->start_ofs,
                        reg->end_ofs - reg->start_ofs));
                }
                else
                {
                    /* unpopulated group - push nil */
                    G_stk->push()->set_nil();
                }

                /* count it */
                ++fargc;
            }

            /* if the index value is desired, push it */
            if (func_argc_max == -1 || func_argc_max >= 2)
            {
                /* push the index of the match relative to basestr */
                G_stk->push()->set_int(
                    utf8_ptr::s_len(basestr, nxt - basestr) + 1);
                ++fargc;
            }

            /* if the match string value is desired, push it */
            if (func_argc_max == -1 || func_argc_max >= 1)
            {
                /* push the match text */
                G_stk->push()->set_obj(
                    CVmObjString::create(vmg_ FALSE, nxt, match_len));
                ++fargc;
            }

            /* call the callback */
            G_interpreter->call_func_ptr(vmg_ func, fargc, &rc, 0);

            /* retrieve the return value */
            ele = *G_interpreter->get_r0();
        }

        /* add it to the list */
        lst->cons_ensure_space(vmg_ cnt, 0);
        lst->cons_set_element(cnt, &ele);

        /* skip the matched text */
        size_t skip = match_bofs + match_len;
        str += skip;
        len -= skip;

        /* 
         *   if we matched zero characters, skip one character to prevent an
         *   infinite loop 
         */
        if (match_len == 0 && len != 0)
            str += utf8_ptr::s_bytelen(str, 1);
    }

    /* finalize the list length */
    lst->cons_set_len(cnt);

    /* discard arguments and gc protection */
    G_stk->discard(orig_argc + 1);

    /* handled */
    return TRUE;
}